

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedTimeZone::getOffset
          (RuleBasedTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,
          uint8_t dayOfWeek,int32_t millis,UErrorCode *status)

{
  UBool UVar1;
  int8_t iVar2;
  uint8_t dayOfWeek_local;
  int32_t day_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  RuleBasedTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((month < 0) || (0xb < month)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = Grego::monthLength(year,month);
      this_local._4_4_ =
           (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                     (this,(ulong)era,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)day,
                      (ulong)dayOfWeek,millis,(int)iVar2,status);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                             uint8_t dayOfWeek, int32_t millis, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (month < UCAL_JANUARY || month > UCAL_DECEMBER) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    } else {
        return getOffset(era, year, month, day, dayOfWeek, millis,
                         Grego::monthLength(year, month), status);
    }
}